

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::prepareProgram
          (FunctionalTest20_21 *this,program **programs,bool is_separable)

{
  program *ppVar1;
  GLchar *subroutine_name;
  GLuint GVar2;
  undefined7 in_register_00000011;
  GLuint *pGVar3;
  long lVar4;
  
  if ((int)CONCAT71(in_register_00000011,is_separable) == 0) {
    Utils::program::build
              (*programs,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\n// Subroutine type\nsubroutine vec4 routine_type(in vec4 left, in vec4 right);\n\n// Subroutine definition\nsubroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n{\n    return left + right;\n}\n\nsubroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n{\n    return left * right;\n}\n\n// Sub routine uniform\nsubroutine uniform routine_type routine;\n\n// Input data\nuniform vec4 uni_fs_left;\nuniform vec4 uni_fs_right;\n\nin vec4 gs_fs_result;\n\n// Output\nout vec4 fs_out_result;\n\nvoid main()\n{\n    fs_out_result = routine(uni_fs_left, uni_fs_right) + gs_fs_result;\n}\n\n"
               ,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\n// Subroutine type\nsubroutine vec4 routine_type(in vec4 left, in vec4 right);\n\n// Subroutine definition\nsubroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n{\n    return left + right;\n}\n\nsubroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n{\n    return left * right;\n}\n\n// Sub routine uniform\nsubroutine uniform routine_type routine;\n\n// Input data\nuniform vec4 uni_gs_left;\nuniform vec4 uni_gs_right;\n\nin vec4 tes_gs_result[];\n\n// Output\nout vec4 gs_fs_result;\n\nvoid main()\n{\n    gs_fs_result = routine(uni_gs_left, uni_gs_right) + tes_gs_result[0];\n}\n\n"
               ,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nlayout(vertices = 1) out;\n\n// Subroutine type\nsubroutine vec4 routine_type(in vec4 left, in vec4 right);\n\n// Subroutine definition\nsubroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n{\n    return left + right;\n}\n\nsubroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n{\n    return left * right;\n}\n\n// Sub routine uniform\nsubroutine uniform routine_type routine;\n\n// Input data\nuniform vec4 uni_tcs_left;\nuniform vec4 uni_tcs_right;\n\nin vec4 vs_tcs_result[];\n\n// Output\nout vec4 tcs_tes_result[];\n\nvoid main()\n{\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n\n    tcs_tes_result[gl_InvocationID] = routine(uni_tcs_left, uni_tcs_right) + vs_tcs_result[gl_InvocationID];\n}\n\n"
               ,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nlayout(isolines, point_mode) in;\n\n// Subroutine type\nsubroutine vec4 routine_type(in vec4 left, in vec4 right);\n\n// Subroutine definition\nsubroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n{\n    return left + right;\n}\n\nsubroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n{\n    return left * right;\n}\n\n// Sub routine uniform\nsubroutine uniform routine_type routine;\n\n// Input data\nuniform vec4 uni_tes_left;\nuniform vec4 uni_tes_right;\n\nin vec4 tcs_tes_result[];\n\n// Output\nout vec4 tes_gs_result;\n\nvoid main()\n{\n    tes_gs_result = routine(uni_tes_left, uni_tes_right) + tcs_tes_result[0];\n}\n\n"
               ,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\n// Subroutine type\nsubroutine vec4 routine_type(in vec4 left, in vec4 right);\n\n// Subroutine definition\nsubroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n{\n    return left + right;\n}\n\nsubroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n{\n    return left * right;\n}\n\n// Sub routine uniform\nsubroutine uniform routine_type routine;\n\n// Input data\nuniform vec4 uni_vs_left;\nuniform vec4 uni_vs_right;\n\n// Output\nout vec4 vs_tcs_result;\n\nvoid main()\n{\n    vs_tcs_result = routine(uni_vs_left, uni_vs_right);\n}\n\n"
               ,(GLchar **)0x0,0,false);
    ppVar1 = *programs;
    programs[1] = ppVar1;
    programs[2] = ppVar1;
    programs[3] = ppVar1;
    programs[4] = ppVar1;
  }
  else {
    Utils::program::build
              (*programs,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\n// Subroutine type\nsubroutine vec4 routine_type(in vec4 left, in vec4 right);\n\n// Subroutine definition\nsubroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n{\n    return left + right;\n}\n\nsubroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n{\n    return left * right;\n}\n\n// Sub routine uniform\nsubroutine uniform routine_type routine;\n\n// Input data\nuniform vec4 uni_fs_left;\nuniform vec4 uni_fs_right;\n\nin vec4 gs_fs_result;\n\n// Output\nout vec4 fs_out_result;\n\nvoid main()\n{\n    fs_out_result = routine(uni_fs_left, uni_fs_right) + gs_fs_result;\n}\n\n"
               ,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar **)0x0,0,true);
    Utils::program::build
              (programs[1],(GLchar *)0x0,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\n// Subroutine type\nsubroutine vec4 routine_type(in vec4 left, in vec4 right);\n\n// Subroutine definition\nsubroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n{\n    return left + right;\n}\n\nsubroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n{\n    return left * right;\n}\n\n// Sub routine uniform\nsubroutine uniform routine_type routine;\n\n// Input data\nuniform vec4 uni_gs_left;\nuniform vec4 uni_gs_right;\n\nin vec4 tes_gs_result[];\n\n// Output\nout vec4 gs_fs_result;\n\nvoid main()\n{\n    gs_fs_result = routine(uni_gs_left, uni_gs_right) + tes_gs_result[0];\n}\n\n"
               ,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar **)0x0,0,true);
    Utils::program::build
              (programs[2],(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nlayout(vertices = 1) out;\n\n// Subroutine type\nsubroutine vec4 routine_type(in vec4 left, in vec4 right);\n\n// Subroutine definition\nsubroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n{\n    return left + right;\n}\n\nsubroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n{\n    return left * right;\n}\n\n// Sub routine uniform\nsubroutine uniform routine_type routine;\n\n// Input data\nuniform vec4 uni_tcs_left;\nuniform vec4 uni_tcs_right;\n\nin vec4 vs_tcs_result[];\n\n// Output\nout vec4 tcs_tes_result[];\n\nvoid main()\n{\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n\n    tcs_tes_result[gl_InvocationID] = routine(uni_tcs_left, uni_tcs_right) + vs_tcs_result[gl_InvocationID];\n}\n\n"
               ,(GLchar *)0x0,(GLchar *)0x0,(GLchar **)0x0,0,true);
    Utils::program::build
              (programs[3],(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nlayout(isolines, point_mode) in;\n\n// Subroutine type\nsubroutine vec4 routine_type(in vec4 left, in vec4 right);\n\n// Subroutine definition\nsubroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n{\n    return left + right;\n}\n\nsubroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n{\n    return left * right;\n}\n\n// Sub routine uniform\nsubroutine uniform routine_type routine;\n\n// Input data\nuniform vec4 uni_tes_left;\nuniform vec4 uni_tes_right;\n\nin vec4 tcs_tes_result[];\n\n// Output\nout vec4 tes_gs_result;\n\nvoid main()\n{\n    tes_gs_result = routine(uni_tes_left, uni_tes_right) + tcs_tes_result[0];\n}\n\n"
               ,(GLchar *)0x0,(GLchar **)0x0,0,true);
    Utils::program::build
              (programs[4],(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\n// Subroutine type\nsubroutine vec4 routine_type(in vec4 left, in vec4 right);\n\n// Subroutine definition\nsubroutine(routine_type) vec4 add(in vec4 left, in vec4 right)\n{\n    return left + right;\n}\n\nsubroutine(routine_type) vec4 multiply(in vec4 left, in vec4 right)\n{\n    return left * right;\n}\n\n// Sub routine uniform\nsubroutine uniform routine_type routine;\n\n// Input data\nuniform vec4 uni_vs_left;\nuniform vec4 uni_vs_right;\n\n// Output\nout vec4 vs_tcs_result;\n\nvoid main()\n{\n    vs_tcs_result = routine(uni_vs_left, uni_vs_right);\n}\n\n"
               ,(GLchar **)0x0,0,true);
  }
  pGVar3 = &this->m_subroutine_indices[0].m_fragment_shader_stage;
  lVar4 = 0;
  do {
    subroutine_name = *(GLchar **)((long)FunctionalTest7_8::iterate::subroutine_names + lVar4);
    GVar2 = Utils::program::getSubroutineIndex(*programs,subroutine_name,0x8b30);
    *pGVar3 = GVar2;
    GVar2 = Utils::program::getSubroutineIndex(programs[1],subroutine_name,0x8dd9);
    pGVar3[-1] = GVar2;
    GVar2 = Utils::program::getSubroutineIndex(programs[2],subroutine_name,0x8e88);
    pGVar3[-3] = GVar2;
    GVar2 = Utils::program::getSubroutineIndex(programs[3],subroutine_name,0x8e87);
    pGVar3[-2] = GVar2;
    GVar2 = Utils::program::getSubroutineIndex(programs[4],subroutine_name,0x8b31);
    ((subroutineUniformSet *)(pGVar3 + -4))->m_vertex_shader_stage = GVar2;
    lVar4 = lVar4 + 8;
    pGVar3 = pGVar3 + 5;
  } while (lVar4 == 8);
  GVar2 = Utils::program::getSubroutineUniformLocation(*programs,"routine",0x8b30);
  (this->m_subroutine_uniform_locations).m_fragment_shader_stage = GVar2;
  GVar2 = Utils::program::getSubroutineUniformLocation(programs[1],"routine",0x8dd9);
  (this->m_subroutine_uniform_locations).m_geometry_shader_stage = GVar2;
  GVar2 = Utils::program::getSubroutineUniformLocation(programs[2],"routine",0x8e88);
  (this->m_subroutine_uniform_locations).m_tesselation_control_shader_stage = GVar2;
  GVar2 = Utils::program::getSubroutineUniformLocation(programs[3],"routine",0x8e87);
  (this->m_subroutine_uniform_locations).m_tesselation_evaluation_shader_stage = GVar2;
  GVar2 = Utils::program::getSubroutineUniformLocation(programs[4],"routine",0x8b31);
  (this->m_subroutine_uniform_locations).m_vertex_shader_stage = GVar2;
  return;
}

Assistant:

void FunctionalTest20_21::prepareProgram(Utils::program** programs, bool is_separable)
{
	/* Get shader sources */
	const GLchar* vertex_shader_code;
	const GLchar* tesselation_control_shader_code;
	const GLchar* tesselation_evaluation_shader_code;
	const GLchar* geometry_shader_code;
	const GLchar* fragmenty_shader_code;

	getShaders(vertex_shader_code, tesselation_control_shader_code, tesselation_evaluation_shader_code,
			   geometry_shader_code, fragmenty_shader_code);

	/* Subroutines and uniform names */
	static const GLchar* subroutine_names[] = { "add", "multiply" };
	static const GLuint  n_subroutines		= sizeof(subroutine_names) / sizeof(subroutine_names[0]);

	static const GLchar* subroutine_uniform_name = "routine";

	/* Build program */
	if (false == is_separable)
	{
		programs[0]->build(0 /* compute shader source */, fragmenty_shader_code, geometry_shader_code,
						   tesselation_control_shader_code, tesselation_evaluation_shader_code, vertex_shader_code,
						   0 /* varying_names */, 0 /* n_varying_names */);

		programs[m_geometry_stage_index]			   = programs[m_fragment_stage_index];
		programs[m_tesselation_control_stage_index]	= programs[m_fragment_stage_index];
		programs[m_tesselation_evaluation_stage_index] = programs[m_fragment_stage_index];
		programs[m_vertex_stage_index]				   = programs[m_fragment_stage_index];
	}
	else
	{
		programs[m_fragment_stage_index]->build(0, fragmenty_shader_code, 0, 0, 0, 0, 0, 0, true);
		programs[m_geometry_stage_index]->build(0, 0, geometry_shader_code, 0, 0, 0, 0, 0, true);
		programs[m_tesselation_control_stage_index]->build(0, 0, 0, tesselation_control_shader_code, 0, 0, 0, 0, true);
		programs[m_tesselation_evaluation_stage_index]->build(0, 0, 0, 0, tesselation_evaluation_shader_code, 0, 0, 0,
															  true);
		programs[m_vertex_stage_index]->build(0, 0, 0, 0, 0, vertex_shader_code, 0, 0, true);
	}

	/* Get subroutine indices */
	for (GLuint i = 0; i < n_subroutines; ++i)
	{
		m_subroutine_indices[i].m_fragment_shader_stage =
			programs[m_fragment_stage_index]->getSubroutineIndex(subroutine_names[i], GL_FRAGMENT_SHADER);

		m_subroutine_indices[i].m_geometry_shader_stage =
			programs[m_geometry_stage_index]->getSubroutineIndex(subroutine_names[i], GL_GEOMETRY_SHADER);

		m_subroutine_indices[i].m_tesselation_control_shader_stage =
			programs[m_tesselation_control_stage_index]->getSubroutineIndex(subroutine_names[i],
																			GL_TESS_CONTROL_SHADER);

		m_subroutine_indices[i].m_tesselation_evaluation_shader_stage =
			programs[m_tesselation_evaluation_stage_index]->getSubroutineIndex(subroutine_names[i],
																			   GL_TESS_EVALUATION_SHADER);

		m_subroutine_indices[i].m_vertex_shader_stage =
			programs[m_vertex_stage_index]->getSubroutineIndex(subroutine_names[i], GL_VERTEX_SHADER);
	}

	/* Get subroutine uniform locations */
	m_subroutine_uniform_locations.m_fragment_shader_stage =
		programs[m_fragment_stage_index]->getSubroutineUniformLocation(subroutine_uniform_name, GL_FRAGMENT_SHADER);

	m_subroutine_uniform_locations.m_geometry_shader_stage =
		programs[m_geometry_stage_index]->getSubroutineUniformLocation(subroutine_uniform_name, GL_GEOMETRY_SHADER);

	m_subroutine_uniform_locations.m_tesselation_control_shader_stage =
		programs[m_tesselation_control_stage_index]->getSubroutineUniformLocation(subroutine_uniform_name,
																				  GL_TESS_CONTROL_SHADER);

	m_subroutine_uniform_locations.m_tesselation_evaluation_shader_stage =
		programs[m_tesselation_evaluation_stage_index]->getSubroutineUniformLocation(subroutine_uniform_name,
																					 GL_TESS_EVALUATION_SHADER);

	m_subroutine_uniform_locations.m_vertex_shader_stage =
		programs[m_vertex_stage_index]->getSubroutineUniformLocation(subroutine_uniform_name, GL_VERTEX_SHADER);
}